

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O1

var * __thiscall
cs::domain_manager::get_var_current<cs::var_id_const&>(domain_manager *this,var_id *name)

{
  stack_pointer psVar1;
  error *peVar2;
  var *pvVar3;
  domain_type *pdVar4;
  string local_30;
  
  psVar1 = *this->fiber_stack;
  if (psVar1 == (stack_pointer)0x0) {
    pdVar4 = (this->m_data).m_current;
    if (pdVar4 == (this->m_data).m_start) {
      peVar2 = (error *)__cxa_allocate_exception(0x28);
      local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
      local_30.field_2._M_allocated_capacity._0_4_ = 0x30303045;
      local_30.field_2._M_allocated_capacity._4_2_ = 0x48;
      local_30._M_string_length = 5;
      cov::error::error(peVar2,&local_30);
      __cxa_throw(peVar2,&cov::error::typeinfo,cov::error::~error);
    }
  }
  else {
    pdVar4 = psVar1->m_current;
    if (pdVar4 == psVar1->m_start) {
      peVar2 = (error *)__cxa_allocate_exception(0x28);
      local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
      local_30.field_2._M_allocated_capacity._0_4_ = 0x30303045;
      local_30.field_2._M_allocated_capacity._4_2_ = 0x48;
      local_30._M_string_length = 5;
      cov::error::error(peVar2,&local_30);
      __cxa_throw(peVar2,&cov::error::typeinfo,cov::error::~error);
    }
  }
  pvVar3 = domain_type::get_var(pdVar4 + -1,name);
  return pvVar3;
}

Assistant:

var &get_var_current(T &&name)
		{
			if (fiber_stack != nullptr)
				return fiber_stack->top().get_var(name);
			else
				return m_data.top().get_var(name);
		}